

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagStackFrame.cpp
# Opt level: O1

void __thiscall
Js::DiagNativeStackFrame::DiagNativeStackFrame
          (DiagNativeStackFrame *this,ScriptFunction *function,int byteCodeOffset,void *stackAddr,
          void *codeAddr)

{
  ScriptContext *this_00;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  undefined4 extraout_var;
  FunctionBody *this_01;
  FunctionEntryPointInfo *pFVar5;
  
  (this->super_DiagStackFrame).isTopFrame = false;
  (this->super_DiagStackFrame)._vptr_DiagStackFrame = (_func_int **)&PTR__DiagStackFrame_014fa610;
  this->m_function = function;
  this->m_byteCodeOffset = byteCodeOffset;
  this->m_stackAddr = stackAddr;
  this->m_localVarSlotsOffset = -1;
  this->m_localVarChangedOffset = -1;
  if (stackAddr == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                                ,0x1ef,"(m_stackAddr != __null)","m_stackAddr != NULL");
    if (!bVar2) goto LAB_008d4c9e;
    *puVar4 = 0;
  }
  if ((this->m_function == (ScriptFunction *)0x0) ||
     (this_00 = (((((this->m_function->super_ScriptFunctionBase).super_JavascriptFunction.
                    super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                super_JavascriptLibraryBase).scriptContext.ptr, this_00 == (ScriptContext *)0x0)) {
LAB_008d4b98:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                                ,0x1f1,
                                "(m_function && m_function->GetScriptContext() && m_function->GetScriptContext()->IsScriptContextInDebugMode())"
                                ,"This only supports functions in debug mode.");
    if (!bVar2) goto LAB_008d4c9e;
    *puVar4 = 0;
  }
  else {
    bVar2 = ScriptContext::IsScriptContextInDebugMode(this_00);
    if (!bVar2) goto LAB_008d4b98;
  }
  iVar3 = (*(this->super_DiagStackFrame)._vptr_DiagStackFrame[2])(this);
  this_01 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)CONCAT44(extraout_var,iVar3));
  pFVar5 = FunctionBody::GetEntryPointFromNativeAddress(this_01,(DWORD_PTR)codeAddr);
  if (pFVar5 == (FunctionEntryPointInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                                ,0x1fb,"(0)",
                                "Failed to get entry point for native address. Most likely the frame is old/gone."
                               );
    if (!bVar2) {
LAB_008d4c9e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  else {
    this->m_localVarSlotsOffset = pFVar5->localVarSlotsOffset;
    this->m_localVarChangedOffset = pFVar5->localVarChangedOffset;
  }
  Output::Trace(DebuggerPhase,
                L"DiagNativeStackFrame::DiagNativeStackFrame: e.p(addr %p)=%p varOff=%d changedOff=%d\n"
                ,codeAddr,pFVar5,(ulong)(uint)this->m_localVarSlotsOffset,
                (ulong)(uint)this->m_localVarChangedOffset);
  return;
}

Assistant:

DiagNativeStackFrame::DiagNativeStackFrame(
        ScriptFunction* function,
        int byteCodeOffset,
        void* stackAddr,
        void *codeAddr) :
        m_function(function),
        m_byteCodeOffset(byteCodeOffset),
        m_stackAddr(stackAddr),
        m_localVarSlotsOffset(InvalidOffset),
        m_localVarChangedOffset(InvalidOffset)
    {
        Assert(m_stackAddr != NULL);
        AssertMsg(m_function && m_function->GetScriptContext() && m_function->GetScriptContext()->IsScriptContextInDebugMode(),
            "This only supports functions in debug mode.");

        FunctionEntryPointInfo * entryPointInfo = GetFunction()->GetEntryPointFromNativeAddress((DWORD_PTR)codeAddr);
        if (entryPointInfo)
        {
            m_localVarSlotsOffset = entryPointInfo->localVarSlotsOffset;
            m_localVarChangedOffset = entryPointInfo->localVarChangedOffset;
        }
        else
        {
            AssertMsg(FALSE, "Failed to get entry point for native address. Most likely the frame is old/gone.");
        }
        OUTPUT_TRACE(Js::DebuggerPhase, _u("DiagNativeStackFrame::DiagNativeStackFrame: e.p(addr %p)=%p varOff=%d changedOff=%d\n"), codeAddr, entryPointInfo, m_localVarSlotsOffset, m_localVarChangedOffset);
    }